

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::CwiseMultiply::backward_impl
          (CwiseMultiply *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  pointer ppTVar1;
  Tensor *pTVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  Index size;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ushort uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  int iVar34;
  int iVar35;
  ulong uVar13;
  
  if (1 < i) {
    __assert_fail("i < 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes.cc"
                  ,0x6f2,
                  "virtual void cnn::CwiseMultiply::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  ppTVar1 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (i == 0) {
    pTVar2 = ppTVar1[1];
    iVar35 = 1;
    iVar34 = 1;
    uVar13 = (ulong)(pTVar2->d).nd;
    if (uVar13 != 0) {
      auVar21 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar24 = vpbroadcastq_avx512f();
      uVar15 = 0;
      do {
        auVar25 = vpbroadcastq_avx512f();
        auVar26 = vmovdqa64_avx512f(auVar21);
        auVar21 = vporq_avx512f(auVar25,auVar22);
        auVar25 = vporq_avx512f(auVar25,auVar23);
        uVar9 = vpcmpuq_avx512f(auVar25,auVar24,2);
        bVar10 = (byte)uVar9;
        uVar9 = vpcmpuq_avx512f(auVar21,auVar24,2);
        bVar11 = (byte)uVar9;
        uVar19 = CONCAT11(bVar11,bVar10);
        auVar25 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar15));
        auVar21._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar25._4_4_;
        auVar21._0_4_ = (uint)(bVar10 & 1) * auVar25._0_4_;
        auVar21._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar25._8_4_;
        auVar21._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar25._12_4_;
        auVar21._16_4_ = (uint)((byte)(uVar19 >> 4) & 1) * auVar25._16_4_;
        auVar21._20_4_ = (uint)((byte)(uVar19 >> 5) & 1) * auVar25._20_4_;
        auVar21._24_4_ = (uint)((byte)(uVar19 >> 6) & 1) * auVar25._24_4_;
        auVar21._28_4_ = (uint)((byte)(uVar19 >> 7) & 1) * auVar25._28_4_;
        auVar21._32_4_ = (uint)(bVar11 & 1) * auVar25._32_4_;
        auVar21._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar25._36_4_;
        auVar21._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar25._40_4_;
        auVar21._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar25._44_4_;
        auVar21._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar25._48_4_;
        auVar21._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar25._52_4_;
        auVar21._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar25._56_4_;
        auVar21._60_4_ = (uint)(bVar11 >> 7) * auVar25._60_4_;
        uVar15 = uVar15 + 0x10;
        auVar21 = vpmulld_avx512f(auVar21,auVar26);
      } while ((uVar13 + 0xf & 0x1fffffff0) != uVar15);
      auVar21 = vmovdqa32_avx512f(auVar21);
      auVar22._0_4_ = (uint)(bVar10 & 1) * auVar21._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar26._0_4_
      ;
      bVar6 = (bool)((byte)(uVar19 >> 1) & 1);
      auVar22._4_4_ = (uint)bVar6 * auVar21._4_4_ | (uint)!bVar6 * auVar26._4_4_;
      bVar6 = (bool)((byte)(uVar19 >> 2) & 1);
      auVar22._8_4_ = (uint)bVar6 * auVar21._8_4_ | (uint)!bVar6 * auVar26._8_4_;
      bVar6 = (bool)((byte)(uVar19 >> 3) & 1);
      auVar22._12_4_ = (uint)bVar6 * auVar21._12_4_ | (uint)!bVar6 * auVar26._12_4_;
      bVar6 = (bool)((byte)(uVar19 >> 4) & 1);
      auVar22._16_4_ = (uint)bVar6 * auVar21._16_4_ | (uint)!bVar6 * auVar26._16_4_;
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      auVar22._20_4_ = (uint)bVar6 * auVar21._20_4_ | (uint)!bVar6 * auVar26._20_4_;
      bVar6 = (bool)((byte)(uVar19 >> 6) & 1);
      auVar22._24_4_ = (uint)bVar6 * auVar21._24_4_ | (uint)!bVar6 * auVar26._24_4_;
      bVar6 = (bool)((byte)(uVar19 >> 7) & 1);
      auVar22._28_4_ = (uint)bVar6 * auVar21._28_4_ | (uint)!bVar6 * auVar26._28_4_;
      auVar22._32_4_ =
           (uint)(bVar11 & 1) * auVar21._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar26._32_4_;
      bVar6 = (bool)(bVar11 >> 1 & 1);
      auVar22._36_4_ = (uint)bVar6 * auVar21._36_4_ | (uint)!bVar6 * auVar26._36_4_;
      bVar6 = (bool)(bVar11 >> 2 & 1);
      auVar22._40_4_ = (uint)bVar6 * auVar21._40_4_ | (uint)!bVar6 * auVar26._40_4_;
      bVar6 = (bool)(bVar11 >> 3 & 1);
      auVar22._44_4_ = (uint)bVar6 * auVar21._44_4_ | (uint)!bVar6 * auVar26._44_4_;
      bVar6 = (bool)(bVar11 >> 4 & 1);
      auVar22._48_4_ = (uint)bVar6 * auVar21._48_4_ | (uint)!bVar6 * auVar26._48_4_;
      bVar6 = (bool)(bVar11 >> 5 & 1);
      auVar22._52_4_ = (uint)bVar6 * auVar21._52_4_ | (uint)!bVar6 * auVar26._52_4_;
      bVar6 = (bool)(bVar11 >> 6 & 1);
      auVar22._56_4_ = (uint)bVar6 * auVar21._56_4_ | (uint)!bVar6 * auVar26._56_4_;
      auVar22._60_4_ =
           (uint)(bVar11 >> 7) * auVar21._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar26._60_4_;
      auVar20 = vextracti64x4_avx512f(auVar22,1);
      auVar21 = vpmulld_avx512f(auVar22,ZEXT3264(auVar20));
      auVar7 = vpmulld_avx(auVar21._0_16_,auVar21._16_16_);
      auVar8 = vpshufd_avx(auVar7,0xee);
      auVar7 = vpmulld_avx(auVar7,auVar8);
      auVar8 = vpshufd_avx(auVar7,0x55);
      auVar7 = vpmulld_avx(auVar7,auVar8);
      iVar34 = auVar7._0_4_;
    }
    uVar14 = iVar34 * (pTVar2->d).bd;
    uVar13 = (ulong)(dEdf->d).nd;
    if (uVar13 != 0) {
      auVar21 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar24 = vpbroadcastq_avx512f();
      uVar15 = 0;
      do {
        auVar25 = vpbroadcastq_avx512f();
        auVar26 = vmovdqa64_avx512f(auVar21);
        auVar21 = vporq_avx512f(auVar25,auVar22);
        auVar25 = vporq_avx512f(auVar25,auVar23);
        uVar9 = vpcmpuq_avx512f(auVar25,auVar24,2);
        bVar10 = (byte)uVar9;
        uVar9 = vpcmpuq_avx512f(auVar21,auVar24,2);
        bVar11 = (byte)uVar9;
        uVar19 = CONCAT11(bVar11,bVar10);
        auVar21 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar15));
        auVar25._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar21._4_4_;
        auVar25._0_4_ = (uint)(bVar10 & 1) * auVar21._0_4_;
        auVar25._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar21._8_4_;
        auVar25._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar21._12_4_;
        auVar25._16_4_ = (uint)((byte)(uVar19 >> 4) & 1) * auVar21._16_4_;
        auVar25._20_4_ = (uint)((byte)(uVar19 >> 5) & 1) * auVar21._20_4_;
        auVar25._24_4_ = (uint)((byte)(uVar19 >> 6) & 1) * auVar21._24_4_;
        auVar25._28_4_ = (uint)((byte)(uVar19 >> 7) & 1) * auVar21._28_4_;
        auVar25._32_4_ = (uint)(bVar11 & 1) * auVar21._32_4_;
        auVar25._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar21._36_4_;
        auVar25._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar21._40_4_;
        auVar25._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar21._44_4_;
        auVar25._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar21._48_4_;
        auVar25._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar21._52_4_;
        auVar25._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar21._56_4_;
        auVar25._60_4_ = (uint)(bVar11 >> 7) * auVar21._60_4_;
        uVar15 = uVar15 + 0x10;
        auVar21 = vpmulld_avx512f(auVar25,auVar26);
      } while ((uVar13 + 0xf & 0x1fffffff0) != uVar15);
      auVar21 = vmovdqa32_avx512f(auVar21);
      auVar23._0_4_ = (uint)(bVar10 & 1) * auVar21._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar26._0_4_
      ;
      bVar6 = (bool)((byte)(uVar19 >> 1) & 1);
      auVar23._4_4_ = (uint)bVar6 * auVar21._4_4_ | (uint)!bVar6 * auVar26._4_4_;
      bVar6 = (bool)((byte)(uVar19 >> 2) & 1);
      auVar23._8_4_ = (uint)bVar6 * auVar21._8_4_ | (uint)!bVar6 * auVar26._8_4_;
      bVar6 = (bool)((byte)(uVar19 >> 3) & 1);
      auVar23._12_4_ = (uint)bVar6 * auVar21._12_4_ | (uint)!bVar6 * auVar26._12_4_;
      bVar6 = (bool)((byte)(uVar19 >> 4) & 1);
      auVar23._16_4_ = (uint)bVar6 * auVar21._16_4_ | (uint)!bVar6 * auVar26._16_4_;
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      auVar23._20_4_ = (uint)bVar6 * auVar21._20_4_ | (uint)!bVar6 * auVar26._20_4_;
      bVar6 = (bool)((byte)(uVar19 >> 6) & 1);
      auVar23._24_4_ = (uint)bVar6 * auVar21._24_4_ | (uint)!bVar6 * auVar26._24_4_;
      bVar6 = (bool)((byte)(uVar19 >> 7) & 1);
      auVar23._28_4_ = (uint)bVar6 * auVar21._28_4_ | (uint)!bVar6 * auVar26._28_4_;
      auVar23._32_4_ =
           (uint)(bVar11 & 1) * auVar21._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar26._32_4_;
      bVar6 = (bool)(bVar11 >> 1 & 1);
      auVar23._36_4_ = (uint)bVar6 * auVar21._36_4_ | (uint)!bVar6 * auVar26._36_4_;
      bVar6 = (bool)(bVar11 >> 2 & 1);
      auVar23._40_4_ = (uint)bVar6 * auVar21._40_4_ | (uint)!bVar6 * auVar26._40_4_;
      bVar6 = (bool)(bVar11 >> 3 & 1);
      auVar23._44_4_ = (uint)bVar6 * auVar21._44_4_ | (uint)!bVar6 * auVar26._44_4_;
      bVar6 = (bool)(bVar11 >> 4 & 1);
      auVar23._48_4_ = (uint)bVar6 * auVar21._48_4_ | (uint)!bVar6 * auVar26._48_4_;
      bVar6 = (bool)(bVar11 >> 5 & 1);
      auVar23._52_4_ = (uint)bVar6 * auVar21._52_4_ | (uint)!bVar6 * auVar26._52_4_;
      bVar6 = (bool)(bVar11 >> 6 & 1);
      auVar23._56_4_ = (uint)bVar6 * auVar21._56_4_ | (uint)!bVar6 * auVar26._56_4_;
      auVar23._60_4_ =
           (uint)(bVar11 >> 7) * auVar21._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar26._60_4_;
      auVar20 = vextracti64x4_avx512f(auVar23,1);
      auVar21 = vpmulld_avx512f(auVar23,ZEXT3264(auVar20));
      auVar7 = vpmulld_avx(auVar21._0_16_,auVar21._16_16_);
      auVar8 = vpshufd_avx(auVar7,0xee);
      auVar7 = vpmulld_avx(auVar7,auVar8);
      auVar8 = vpshufd_avx(auVar7,0x55);
      auVar7 = vpmulld_avx(auVar7,auVar8);
      iVar35 = auVar7._0_4_;
    }
    if (iVar35 * (dEdf->d).bd != uVar14) goto LAB_001c6037;
    uVar13 = (ulong)(dEdxi->d).nd;
    if (uVar13 == 0) {
      iVar34 = 1;
    }
    else {
      auVar21 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar24 = vpbroadcastq_avx512f();
      uVar15 = 0;
      do {
        auVar25 = vpbroadcastq_avx512f();
        auVar26 = vmovdqa64_avx512f(auVar21);
        auVar21 = vporq_avx512f(auVar25,auVar22);
        auVar25 = vporq_avx512f(auVar25,auVar23);
        uVar9 = vpcmpuq_avx512f(auVar25,auVar24,2);
        bVar10 = (byte)uVar9;
        uVar9 = vpcmpuq_avx512f(auVar21,auVar24,2);
        bVar11 = (byte)uVar9;
        uVar19 = CONCAT11(bVar11,bVar10);
        auVar21 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar15));
        auVar33._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar21._4_4_;
        auVar33._0_4_ = (uint)(bVar10 & 1) * auVar21._0_4_;
        auVar33._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar21._8_4_;
        auVar33._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar21._12_4_;
        auVar33._16_4_ = (uint)((byte)(uVar19 >> 4) & 1) * auVar21._16_4_;
        auVar33._20_4_ = (uint)((byte)(uVar19 >> 5) & 1) * auVar21._20_4_;
        auVar33._24_4_ = (uint)((byte)(uVar19 >> 6) & 1) * auVar21._24_4_;
        auVar33._28_4_ = (uint)((byte)(uVar19 >> 7) & 1) * auVar21._28_4_;
        auVar33._32_4_ = (uint)(bVar11 & 1) * auVar21._32_4_;
        auVar33._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar21._36_4_;
        auVar33._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar21._40_4_;
        auVar33._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar21._44_4_;
        auVar33._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar21._48_4_;
        auVar33._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar21._52_4_;
        auVar33._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar21._56_4_;
        auVar33._60_4_ = (uint)(bVar11 >> 7) * auVar21._60_4_;
        uVar15 = uVar15 + 0x10;
        auVar21 = vpmulld_avx512f(auVar33,auVar26);
      } while ((uVar13 + 0xf & 0x1fffffff0) != uVar15);
      auVar21 = vmovdqa32_avx512f(auVar21);
      auVar24._0_4_ = (uint)(bVar10 & 1) * auVar21._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar26._0_4_
      ;
      bVar6 = (bool)((byte)(uVar19 >> 1) & 1);
      auVar24._4_4_ = (uint)bVar6 * auVar21._4_4_ | (uint)!bVar6 * auVar26._4_4_;
      bVar6 = (bool)((byte)(uVar19 >> 2) & 1);
      auVar24._8_4_ = (uint)bVar6 * auVar21._8_4_ | (uint)!bVar6 * auVar26._8_4_;
      bVar6 = (bool)((byte)(uVar19 >> 3) & 1);
      auVar24._12_4_ = (uint)bVar6 * auVar21._12_4_ | (uint)!bVar6 * auVar26._12_4_;
      bVar6 = (bool)((byte)(uVar19 >> 4) & 1);
      auVar24._16_4_ = (uint)bVar6 * auVar21._16_4_ | (uint)!bVar6 * auVar26._16_4_;
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      auVar24._20_4_ = (uint)bVar6 * auVar21._20_4_ | (uint)!bVar6 * auVar26._20_4_;
      bVar6 = (bool)((byte)(uVar19 >> 6) & 1);
      auVar24._24_4_ = (uint)bVar6 * auVar21._24_4_ | (uint)!bVar6 * auVar26._24_4_;
      bVar6 = (bool)((byte)(uVar19 >> 7) & 1);
      auVar24._28_4_ = (uint)bVar6 * auVar21._28_4_ | (uint)!bVar6 * auVar26._28_4_;
      auVar24._32_4_ =
           (uint)(bVar11 & 1) * auVar21._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar26._32_4_;
      bVar6 = (bool)(bVar11 >> 1 & 1);
      auVar24._36_4_ = (uint)bVar6 * auVar21._36_4_ | (uint)!bVar6 * auVar26._36_4_;
      bVar6 = (bool)(bVar11 >> 2 & 1);
      auVar24._40_4_ = (uint)bVar6 * auVar21._40_4_ | (uint)!bVar6 * auVar26._40_4_;
      bVar6 = (bool)(bVar11 >> 3 & 1);
      auVar24._44_4_ = (uint)bVar6 * auVar21._44_4_ | (uint)!bVar6 * auVar26._44_4_;
      bVar6 = (bool)(bVar11 >> 4 & 1);
      auVar24._48_4_ = (uint)bVar6 * auVar21._48_4_ | (uint)!bVar6 * auVar26._48_4_;
      bVar6 = (bool)(bVar11 >> 5 & 1);
      auVar24._52_4_ = (uint)bVar6 * auVar21._52_4_ | (uint)!bVar6 * auVar26._52_4_;
      bVar6 = (bool)(bVar11 >> 6 & 1);
      auVar24._56_4_ = (uint)bVar6 * auVar21._56_4_ | (uint)!bVar6 * auVar26._56_4_;
      auVar24._60_4_ =
           (uint)(bVar11 >> 7) * auVar21._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar26._60_4_;
      auVar20 = vextracti64x4_avx512f(auVar24,1);
      auVar21 = vpmulld_avx512f(auVar24,ZEXT3264(auVar20));
      auVar7 = vpmulld_avx(auVar21._0_16_,auVar21._16_16_);
      auVar8 = vpshufd_avx(auVar7,0xee);
      auVar7 = vpmulld_avx(auVar7,auVar8);
      auVar8 = vpshufd_avx(auVar7,0x55);
      auVar7 = vpmulld_avx(auVar7,auVar8);
      iVar34 = auVar7._0_4_;
    }
    uVar12 = iVar34 * (dEdxi->d).bd;
    uVar13 = (ulong)uVar12;
    if (uVar12 != uVar14) goto LAB_001c6059;
    pfVar3 = dEdxi->v;
    uVar15 = uVar13;
    if ((((ulong)pfVar3 & 3) == 0) &&
       (uVar15 = (ulong)(-((uint)((ulong)pfVar3 >> 2) & 0x3fffffff) & 0xf), uVar13 <= uVar15)) {
      uVar15 = uVar13;
    }
    pfVar4 = pTVar2->v;
    pfVar5 = dEdf->v;
    uVar17 = uVar13 - uVar15;
    uVar16 = uVar17 + 0xf;
    if (-1 < (long)uVar17) {
      uVar16 = uVar17;
    }
    if (uVar15 != 0) {
      uVar18 = 0;
      do {
        auVar7 = vfmadd213ss_fma(ZEXT416((uint)pfVar4[uVar18]),ZEXT416((uint)pfVar5[uVar18]),
                                 ZEXT416((uint)pfVar3[uVar18]));
        pfVar3[uVar18] = auVar7._0_4_;
        uVar18 = uVar18 + 1;
      } while (uVar15 != uVar18);
    }
    uVar16 = (uVar16 & 0xfffffffffffffff0) + uVar15;
    if (0xf < (long)uVar17) {
      do {
        auVar21 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(pfVar4 + uVar15),
                                      *(undefined1 (*) [64])(pfVar5 + uVar15),
                                      *(undefined1 (*) [64])(pfVar3 + uVar15));
        *(undefined1 (*) [64])(pfVar3 + uVar15) = auVar21;
        uVar15 = uVar15 + 0x10;
      } while ((long)uVar15 < (long)uVar16);
    }
    if ((long)uVar16 < (long)uVar13) {
      do {
        auVar7 = vfmadd213ss_fma(ZEXT416((uint)pfVar4[uVar16]),ZEXT416((uint)pfVar5[uVar16]),
                                 ZEXT416((uint)pfVar3[uVar16]));
        pfVar3[uVar16] = auVar7._0_4_;
        uVar16 = uVar16 + 1;
      } while (uVar13 != uVar16);
    }
  }
  else {
    pTVar2 = *ppTVar1;
    iVar35 = 1;
    iVar34 = 1;
    uVar13 = (ulong)(pTVar2->d).nd;
    if (uVar13 != 0) {
      auVar21 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar24 = vpbroadcastq_avx512f();
      uVar15 = 0;
      do {
        auVar25 = vpbroadcastq_avx512f();
        auVar26 = vmovdqa64_avx512f(auVar21);
        auVar21 = vporq_avx512f(auVar25,auVar22);
        auVar25 = vporq_avx512f(auVar25,auVar23);
        uVar9 = vpcmpuq_avx512f(auVar25,auVar24,2);
        bVar10 = (byte)uVar9;
        uVar9 = vpcmpuq_avx512f(auVar21,auVar24,2);
        bVar11 = (byte)uVar9;
        uVar19 = CONCAT11(bVar11,bVar10);
        auVar21 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar15));
        auVar27._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar21._4_4_;
        auVar27._0_4_ = (uint)(bVar10 & 1) * auVar21._0_4_;
        auVar27._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar21._8_4_;
        auVar27._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar21._12_4_;
        auVar27._16_4_ = (uint)((byte)(uVar19 >> 4) & 1) * auVar21._16_4_;
        auVar27._20_4_ = (uint)((byte)(uVar19 >> 5) & 1) * auVar21._20_4_;
        auVar27._24_4_ = (uint)((byte)(uVar19 >> 6) & 1) * auVar21._24_4_;
        auVar27._28_4_ = (uint)((byte)(uVar19 >> 7) & 1) * auVar21._28_4_;
        auVar27._32_4_ = (uint)(bVar11 & 1) * auVar21._32_4_;
        auVar27._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar21._36_4_;
        auVar27._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar21._40_4_;
        auVar27._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar21._44_4_;
        auVar27._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar21._48_4_;
        auVar27._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar21._52_4_;
        auVar27._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar21._56_4_;
        auVar27._60_4_ = (uint)(bVar11 >> 7) * auVar21._60_4_;
        uVar15 = uVar15 + 0x10;
        auVar21 = vpmulld_avx512f(auVar27,auVar26);
      } while ((uVar13 + 0xf & 0x1fffffff0) != uVar15);
      auVar21 = vmovdqa32_avx512f(auVar21);
      auVar28._0_4_ = (uint)(bVar10 & 1) * auVar21._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar26._0_4_
      ;
      bVar6 = (bool)((byte)(uVar19 >> 1) & 1);
      auVar28._4_4_ = (uint)bVar6 * auVar21._4_4_ | (uint)!bVar6 * auVar26._4_4_;
      bVar6 = (bool)((byte)(uVar19 >> 2) & 1);
      auVar28._8_4_ = (uint)bVar6 * auVar21._8_4_ | (uint)!bVar6 * auVar26._8_4_;
      bVar6 = (bool)((byte)(uVar19 >> 3) & 1);
      auVar28._12_4_ = (uint)bVar6 * auVar21._12_4_ | (uint)!bVar6 * auVar26._12_4_;
      bVar6 = (bool)((byte)(uVar19 >> 4) & 1);
      auVar28._16_4_ = (uint)bVar6 * auVar21._16_4_ | (uint)!bVar6 * auVar26._16_4_;
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      auVar28._20_4_ = (uint)bVar6 * auVar21._20_4_ | (uint)!bVar6 * auVar26._20_4_;
      bVar6 = (bool)((byte)(uVar19 >> 6) & 1);
      auVar28._24_4_ = (uint)bVar6 * auVar21._24_4_ | (uint)!bVar6 * auVar26._24_4_;
      bVar6 = (bool)((byte)(uVar19 >> 7) & 1);
      auVar28._28_4_ = (uint)bVar6 * auVar21._28_4_ | (uint)!bVar6 * auVar26._28_4_;
      auVar28._32_4_ =
           (uint)(bVar11 & 1) * auVar21._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar26._32_4_;
      bVar6 = (bool)(bVar11 >> 1 & 1);
      auVar28._36_4_ = (uint)bVar6 * auVar21._36_4_ | (uint)!bVar6 * auVar26._36_4_;
      bVar6 = (bool)(bVar11 >> 2 & 1);
      auVar28._40_4_ = (uint)bVar6 * auVar21._40_4_ | (uint)!bVar6 * auVar26._40_4_;
      bVar6 = (bool)(bVar11 >> 3 & 1);
      auVar28._44_4_ = (uint)bVar6 * auVar21._44_4_ | (uint)!bVar6 * auVar26._44_4_;
      bVar6 = (bool)(bVar11 >> 4 & 1);
      auVar28._48_4_ = (uint)bVar6 * auVar21._48_4_ | (uint)!bVar6 * auVar26._48_4_;
      bVar6 = (bool)(bVar11 >> 5 & 1);
      auVar28._52_4_ = (uint)bVar6 * auVar21._52_4_ | (uint)!bVar6 * auVar26._52_4_;
      bVar6 = (bool)(bVar11 >> 6 & 1);
      auVar28._56_4_ = (uint)bVar6 * auVar21._56_4_ | (uint)!bVar6 * auVar26._56_4_;
      auVar28._60_4_ =
           (uint)(bVar11 >> 7) * auVar21._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar26._60_4_;
      auVar20 = vextracti64x4_avx512f(auVar28,1);
      auVar21 = vpmulld_avx512f(auVar28,ZEXT3264(auVar20));
      auVar7 = vpmulld_avx(auVar21._0_16_,auVar21._16_16_);
      auVar8 = vpshufd_avx(auVar7,0xee);
      auVar7 = vpmulld_avx(auVar7,auVar8);
      auVar8 = vpshufd_avx(auVar7,0x55);
      auVar7 = vpmulld_avx(auVar7,auVar8);
      iVar34 = auVar7._0_4_;
    }
    uVar14 = iVar34 * (pTVar2->d).bd;
    uVar13 = (ulong)(dEdf->d).nd;
    if (uVar13 != 0) {
      auVar21 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar24 = vpbroadcastq_avx512f();
      uVar15 = 0;
      do {
        auVar25 = vpbroadcastq_avx512f();
        auVar26 = vmovdqa64_avx512f(auVar21);
        auVar21 = vporq_avx512f(auVar25,auVar22);
        auVar25 = vporq_avx512f(auVar25,auVar23);
        uVar9 = vpcmpuq_avx512f(auVar25,auVar24,2);
        bVar10 = (byte)uVar9;
        uVar9 = vpcmpuq_avx512f(auVar21,auVar24,2);
        bVar11 = (byte)uVar9;
        uVar19 = CONCAT11(bVar11,bVar10);
        auVar21 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar15));
        auVar29._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar21._4_4_;
        auVar29._0_4_ = (uint)(bVar10 & 1) * auVar21._0_4_;
        auVar29._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar21._8_4_;
        auVar29._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar21._12_4_;
        auVar29._16_4_ = (uint)((byte)(uVar19 >> 4) & 1) * auVar21._16_4_;
        auVar29._20_4_ = (uint)((byte)(uVar19 >> 5) & 1) * auVar21._20_4_;
        auVar29._24_4_ = (uint)((byte)(uVar19 >> 6) & 1) * auVar21._24_4_;
        auVar29._28_4_ = (uint)((byte)(uVar19 >> 7) & 1) * auVar21._28_4_;
        auVar29._32_4_ = (uint)(bVar11 & 1) * auVar21._32_4_;
        auVar29._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar21._36_4_;
        auVar29._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar21._40_4_;
        auVar29._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar21._44_4_;
        auVar29._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar21._48_4_;
        auVar29._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar21._52_4_;
        auVar29._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar21._56_4_;
        auVar29._60_4_ = (uint)(bVar11 >> 7) * auVar21._60_4_;
        uVar15 = uVar15 + 0x10;
        auVar21 = vpmulld_avx512f(auVar29,auVar26);
      } while ((uVar13 + 0xf & 0x1fffffff0) != uVar15);
      auVar21 = vmovdqa32_avx512f(auVar21);
      auVar30._0_4_ = (uint)(bVar10 & 1) * auVar21._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar26._0_4_
      ;
      bVar6 = (bool)((byte)(uVar19 >> 1) & 1);
      auVar30._4_4_ = (uint)bVar6 * auVar21._4_4_ | (uint)!bVar6 * auVar26._4_4_;
      bVar6 = (bool)((byte)(uVar19 >> 2) & 1);
      auVar30._8_4_ = (uint)bVar6 * auVar21._8_4_ | (uint)!bVar6 * auVar26._8_4_;
      bVar6 = (bool)((byte)(uVar19 >> 3) & 1);
      auVar30._12_4_ = (uint)bVar6 * auVar21._12_4_ | (uint)!bVar6 * auVar26._12_4_;
      bVar6 = (bool)((byte)(uVar19 >> 4) & 1);
      auVar30._16_4_ = (uint)bVar6 * auVar21._16_4_ | (uint)!bVar6 * auVar26._16_4_;
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      auVar30._20_4_ = (uint)bVar6 * auVar21._20_4_ | (uint)!bVar6 * auVar26._20_4_;
      bVar6 = (bool)((byte)(uVar19 >> 6) & 1);
      auVar30._24_4_ = (uint)bVar6 * auVar21._24_4_ | (uint)!bVar6 * auVar26._24_4_;
      bVar6 = (bool)((byte)(uVar19 >> 7) & 1);
      auVar30._28_4_ = (uint)bVar6 * auVar21._28_4_ | (uint)!bVar6 * auVar26._28_4_;
      auVar30._32_4_ =
           (uint)(bVar11 & 1) * auVar21._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar26._32_4_;
      bVar6 = (bool)(bVar11 >> 1 & 1);
      auVar30._36_4_ = (uint)bVar6 * auVar21._36_4_ | (uint)!bVar6 * auVar26._36_4_;
      bVar6 = (bool)(bVar11 >> 2 & 1);
      auVar30._40_4_ = (uint)bVar6 * auVar21._40_4_ | (uint)!bVar6 * auVar26._40_4_;
      bVar6 = (bool)(bVar11 >> 3 & 1);
      auVar30._44_4_ = (uint)bVar6 * auVar21._44_4_ | (uint)!bVar6 * auVar26._44_4_;
      bVar6 = (bool)(bVar11 >> 4 & 1);
      auVar30._48_4_ = (uint)bVar6 * auVar21._48_4_ | (uint)!bVar6 * auVar26._48_4_;
      bVar6 = (bool)(bVar11 >> 5 & 1);
      auVar30._52_4_ = (uint)bVar6 * auVar21._52_4_ | (uint)!bVar6 * auVar26._52_4_;
      bVar6 = (bool)(bVar11 >> 6 & 1);
      auVar30._56_4_ = (uint)bVar6 * auVar21._56_4_ | (uint)!bVar6 * auVar26._56_4_;
      auVar30._60_4_ =
           (uint)(bVar11 >> 7) * auVar21._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar26._60_4_;
      auVar20 = vextracti64x4_avx512f(auVar30,1);
      auVar21 = vpmulld_avx512f(auVar30,ZEXT3264(auVar20));
      auVar7 = vpmulld_avx(auVar21._0_16_,auVar21._16_16_);
      auVar8 = vpshufd_avx(auVar7,0xee);
      auVar7 = vpmulld_avx(auVar7,auVar8);
      auVar8 = vpshufd_avx(auVar7,0x55);
      auVar7 = vpmulld_avx(auVar7,auVar8);
      iVar35 = auVar7._0_4_;
    }
    if (iVar35 * (dEdf->d).bd != uVar14) {
LAB_001c6037:
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                   );
    }
    uVar13 = (ulong)(dEdxi->d).nd;
    if (uVar13 == 0) {
      iVar34 = 1;
    }
    else {
      auVar21 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar24 = vpbroadcastq_avx512f();
      uVar15 = 0;
      do {
        auVar25 = vpbroadcastq_avx512f();
        auVar26 = vmovdqa64_avx512f(auVar21);
        auVar21 = vporq_avx512f(auVar25,auVar22);
        auVar25 = vporq_avx512f(auVar25,auVar23);
        uVar9 = vpcmpuq_avx512f(auVar25,auVar24,2);
        bVar10 = (byte)uVar9;
        uVar9 = vpcmpuq_avx512f(auVar21,auVar24,2);
        bVar11 = (byte)uVar9;
        uVar19 = CONCAT11(bVar11,bVar10);
        auVar21 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar15));
        auVar31._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar21._4_4_;
        auVar31._0_4_ = (uint)(bVar10 & 1) * auVar21._0_4_;
        auVar31._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar21._8_4_;
        auVar31._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar21._12_4_;
        auVar31._16_4_ = (uint)((byte)(uVar19 >> 4) & 1) * auVar21._16_4_;
        auVar31._20_4_ = (uint)((byte)(uVar19 >> 5) & 1) * auVar21._20_4_;
        auVar31._24_4_ = (uint)((byte)(uVar19 >> 6) & 1) * auVar21._24_4_;
        auVar31._28_4_ = (uint)((byte)(uVar19 >> 7) & 1) * auVar21._28_4_;
        auVar31._32_4_ = (uint)(bVar11 & 1) * auVar21._32_4_;
        auVar31._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar21._36_4_;
        auVar31._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar21._40_4_;
        auVar31._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar21._44_4_;
        auVar31._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar21._48_4_;
        auVar31._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar21._52_4_;
        auVar31._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar21._56_4_;
        auVar31._60_4_ = (uint)(bVar11 >> 7) * auVar21._60_4_;
        uVar15 = uVar15 + 0x10;
        auVar21 = vpmulld_avx512f(auVar31,auVar26);
      } while ((uVar13 + 0xf & 0x1fffffff0) != uVar15);
      auVar21 = vmovdqa32_avx512f(auVar21);
      auVar32._0_4_ = (uint)(bVar10 & 1) * auVar21._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar26._0_4_
      ;
      bVar6 = (bool)((byte)(uVar19 >> 1) & 1);
      auVar32._4_4_ = (uint)bVar6 * auVar21._4_4_ | (uint)!bVar6 * auVar26._4_4_;
      bVar6 = (bool)((byte)(uVar19 >> 2) & 1);
      auVar32._8_4_ = (uint)bVar6 * auVar21._8_4_ | (uint)!bVar6 * auVar26._8_4_;
      bVar6 = (bool)((byte)(uVar19 >> 3) & 1);
      auVar32._12_4_ = (uint)bVar6 * auVar21._12_4_ | (uint)!bVar6 * auVar26._12_4_;
      bVar6 = (bool)((byte)(uVar19 >> 4) & 1);
      auVar32._16_4_ = (uint)bVar6 * auVar21._16_4_ | (uint)!bVar6 * auVar26._16_4_;
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      auVar32._20_4_ = (uint)bVar6 * auVar21._20_4_ | (uint)!bVar6 * auVar26._20_4_;
      bVar6 = (bool)((byte)(uVar19 >> 6) & 1);
      auVar32._24_4_ = (uint)bVar6 * auVar21._24_4_ | (uint)!bVar6 * auVar26._24_4_;
      bVar6 = (bool)((byte)(uVar19 >> 7) & 1);
      auVar32._28_4_ = (uint)bVar6 * auVar21._28_4_ | (uint)!bVar6 * auVar26._28_4_;
      auVar32._32_4_ =
           (uint)(bVar11 & 1) * auVar21._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar26._32_4_;
      bVar6 = (bool)(bVar11 >> 1 & 1);
      auVar32._36_4_ = (uint)bVar6 * auVar21._36_4_ | (uint)!bVar6 * auVar26._36_4_;
      bVar6 = (bool)(bVar11 >> 2 & 1);
      auVar32._40_4_ = (uint)bVar6 * auVar21._40_4_ | (uint)!bVar6 * auVar26._40_4_;
      bVar6 = (bool)(bVar11 >> 3 & 1);
      auVar32._44_4_ = (uint)bVar6 * auVar21._44_4_ | (uint)!bVar6 * auVar26._44_4_;
      bVar6 = (bool)(bVar11 >> 4 & 1);
      auVar32._48_4_ = (uint)bVar6 * auVar21._48_4_ | (uint)!bVar6 * auVar26._48_4_;
      bVar6 = (bool)(bVar11 >> 5 & 1);
      auVar32._52_4_ = (uint)bVar6 * auVar21._52_4_ | (uint)!bVar6 * auVar26._52_4_;
      bVar6 = (bool)(bVar11 >> 6 & 1);
      auVar32._56_4_ = (uint)bVar6 * auVar21._56_4_ | (uint)!bVar6 * auVar26._56_4_;
      auVar32._60_4_ =
           (uint)(bVar11 >> 7) * auVar21._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar26._60_4_;
      auVar20 = vextracti64x4_avx512f(auVar32,1);
      auVar21 = vpmulld_avx512f(auVar32,ZEXT3264(auVar20));
      auVar7 = vpmulld_avx(auVar21._0_16_,auVar21._16_16_);
      auVar8 = vpshufd_avx(auVar7,0xee);
      auVar7 = vpmulld_avx(auVar7,auVar8);
      auVar8 = vpshufd_avx(auVar7,0x55);
      auVar7 = vpmulld_avx(auVar7,auVar8);
      iVar34 = auVar7._0_4_;
    }
    uVar12 = iVar34 * (dEdxi->d).bd;
    uVar13 = (ulong)uVar12;
    if (uVar12 != uVar14) {
LAB_001c6059:
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                   );
    }
    pfVar3 = dEdxi->v;
    uVar15 = uVar13;
    if ((((ulong)pfVar3 & 3) == 0) &&
       (uVar15 = (ulong)(-((uint)((ulong)pfVar3 >> 2) & 0x3fffffff) & 0xf), uVar13 <= uVar15)) {
      uVar15 = uVar13;
    }
    pfVar4 = pTVar2->v;
    pfVar5 = dEdf->v;
    uVar17 = uVar13 - uVar15;
    uVar16 = uVar17 + 0xf;
    if (-1 < (long)uVar17) {
      uVar16 = uVar17;
    }
    if (uVar15 != 0) {
      uVar18 = 0;
      do {
        auVar7 = vfmadd213ss_fma(ZEXT416((uint)pfVar4[uVar18]),ZEXT416((uint)pfVar5[uVar18]),
                                 ZEXT416((uint)pfVar3[uVar18]));
        pfVar3[uVar18] = auVar7._0_4_;
        uVar18 = uVar18 + 1;
      } while (uVar15 != uVar18);
    }
    uVar16 = (uVar16 & 0xfffffffffffffff0) + uVar15;
    if (0xf < (long)uVar17) {
      do {
        auVar21 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(pfVar4 + uVar15),
                                      *(undefined1 (*) [64])(pfVar5 + uVar15),
                                      *(undefined1 (*) [64])(pfVar3 + uVar15));
        *(undefined1 (*) [64])(pfVar3 + uVar15) = auVar21;
        uVar15 = uVar15 + 0x10;
      } while ((long)uVar15 < (long)uVar16);
    }
    if ((long)uVar16 < (long)uVar13) {
      do {
        auVar7 = vfmadd213ss_fma(ZEXT416((uint)pfVar4[uVar16]),ZEXT416((uint)pfVar5[uVar16]),
                                 ZEXT416((uint)pfVar3[uVar16]));
        pfVar3[uVar16] = auVar7._0_4_;
        uVar16 = uVar16 + 1;
      } while (uVar13 != uVar16);
    }
  }
  return;
}

Assistant:

void CwiseMultiply::backward_impl(const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  assert(i < 2);
  if (i == 0) {
#if HAVE_CUDA
    gpu::vcwise_product_backward(fx.d.size(), dEdf.v, xs[1]->v, dEdxi.v);
#else
    auto x2 = xs[1]->vec();
    dEdxi.vec() += dEdf.vec().cwiseProduct(x2);
#endif
  } else {
#if HAVE_CUDA
    gpu::vcwise_product_backward(fx.d.size(), dEdf.v, xs[0]->v, dEdxi.v);
#else
    auto x1 = xs[0]->vec();
    dEdxi.vec() += dEdf.vec().cwiseProduct(x1);
#endif
  }
}